

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::setVisibleHelper
          (QGraphicsItemPrivate *this,bool newVisible,bool explicitly,bool update,bool hiddenByPanel
          )

{
  long *plVar1;
  long *plVar2;
  undefined8 *puVar3;
  QGraphicsItem *this_00;
  ulong uVar4;
  QGraphicsItem **ppQVar5;
  long lVar6;
  ExtraStruct *pEVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  WindowType WVar11;
  int iVar12;
  QMetaType QVar13;
  QGraphicsItem *pQVar14;
  QGraphicsItem *pQVar15;
  QGraphicsItem *pQVar16;
  long lVar17;
  QGraphicsItemPrivate *pQVar18;
  undefined7 in_register_00000011;
  long lVar19;
  ExtraStruct *pEVar20;
  ulong uVar21;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  undefined8 this_02;
  QGraphicsWidget *widget;
  long in_FS_OFFSET;
  void *t;
  QMetaType local_a0;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  ulong uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,explicitly) != 0) {
    *(ulong *)&this->field_0x160 =
         *(ulong *)&this->field_0x160 & 0xffffffffffffffbf | (ulong)!newVisible << 6;
  }
  if (((this->field_0x160 & 0x20) == 0) != newVisible) goto LAB_005e518c;
  this_00 = this->q_ptr;
  if ((newVisible && this->parent != (QGraphicsItem *)0x0) &&
     ((((this->parent->d_ptr).d)->field_0x160 & 0x20) == 0)) goto LAB_005e518c;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = &local_78;
  ::QVariant::QVariant((QVariant *)this_01,(uint)newVisible);
  (*this_00->_vptr_QGraphicsItem[0x21])(&local_58,this_00,2,this_01);
  ::QVariant::~QVariant((QVariant *)this_01);
  bVar8 = (bool)::QVariant::toBool();
  if (((*(ulong *)&this->field_0x160 & 0x20) == 0) == bVar8) {
    *(ulong *)&this->field_0x160 =
         *(ulong *)&this->field_0x160 & 0xffffffffffffffdf | (ulong)bVar8 << 5;
    if (update) {
      uVar4 = (this->extras).d.size;
      if (uVar4 == 0) {
LAB_005e4b37:
        local_78.shared = (PrivateShared *)0x0;
        local_78._8_8_ = 0;
        local_78._16_8_ = 0;
        uStack_60 = 2;
      }
      else {
        pEVar20 = (this->extras).d.ptr;
        if (pEVar20->type == ExtraCacheData) {
          ::QVariant::QVariant((QVariant *)&local_78,&pEVar20->value);
        }
        else {
          uVar21 = 0;
          do {
            pEVar7 = pEVar20;
            pEVar20 = pEVar7 + 1;
            if (uVar4 - 1 == uVar21) goto LAB_005e4b37;
            uVar21 = uVar21 + 1;
          } while (pEVar20->type != ExtraCacheData);
          ::QVariant::QVariant((QVariant *)&local_78,&pEVar7[1].value);
          if (uVar4 <= uVar21) goto LAB_005e4b37;
        }
      }
      local_a0.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType;
      t = (void *)(uStack_60 & 0xfffffffffffffffc);
      bVar9 = comparesEqual((QMetaType *)&t,&local_a0);
      if (bVar9) {
        this_02 = local_78.shared;
        if ((uStack_60 & 1) != 0) {
          this_02 = *(undefined8 *)(local_78.shared + *(int *)(local_78.shared + 4));
        }
      }
      else {
        t = (void *)0x0;
        QVar13.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((uStack_60 & 1) != 0) {
          this_01 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_78.shared + *(int *)(local_78.shared + 4));
        }
        QMetaType::convert(QVar13,this_01,local_a0,&t);
        this_02 = t;
      }
      ::QVariant::~QVariant((QVariant *)&local_78);
      if ((QGraphicsItemCache *)this_02 != (QGraphicsItemCache *)0x0) {
        QGraphicsItemCache::purge((QGraphicsItemCache *)this_02);
      }
      if (this->scene != (QGraphicsScene *)0x0) {
        invalidateParentGraphicsEffectsRecursively(this);
        local_78._16_8_ = 0;
        uStack_60 = 0;
        local_78.shared = (PrivateShared *)0x0;
        local_78._8_8_ = 0;
        QGraphicsScenePrivate::markDirty
                  (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr,
                   (QRectF *)&local_78,false,true,false,false,false);
      }
    }
    bVar9 = QGraphicsItem::hasFocus(this->q_ptr);
    if (bVar8 == false) {
      if (this->scene != (QGraphicsScene *)0x0) {
        lVar17 = *(long *)&this->scene->field_0x8;
        plVar1 = (long *)(lVar17 + 0x1f0);
        if (*plVar1 == 0) {
LAB_005e4d58:
          lVar17 = -1;
        }
        else {
          plVar2 = (long *)(lVar17 + 0x1e8);
          lVar19 = -8;
          do {
            lVar6 = *plVar1 * -8 + lVar19;
            if (lVar6 == -8) goto LAB_005e4d52;
            lVar17 = lVar19 + 8;
            puVar3 = (undefined8 *)(*plVar2 + 8 + lVar19);
            lVar19 = lVar17;
          } while ((QGraphicsItem *)*puVar3 != this_00);
          lVar17 = lVar17 >> 3;
LAB_005e4d52:
          if (lVar6 == -8) goto LAB_005e4d58;
        }
        if (lVar17 != -1) {
          QGraphicsItem::ungrabMouse(this_00);
        }
        lVar17 = *(long *)&this->scene->field_0x8;
        plVar1 = (long *)(lVar17 + 0x208);
        if (*plVar1 == 0) {
LAB_005e4dbb:
          lVar17 = -1;
        }
        else {
          plVar2 = (long *)(lVar17 + 0x200);
          lVar19 = -8;
          do {
            lVar6 = *plVar1 * -8 + lVar19;
            if (lVar6 == -8) goto LAB_005e4db5;
            lVar17 = lVar19 + 8;
            puVar3 = (undefined8 *)(*plVar2 + 8 + lVar19);
            lVar19 = lVar17;
          } while ((QGraphicsItem *)*puVar3 != this_00);
          lVar17 = lVar17 >> 3;
LAB_005e4db5:
          if (lVar6 == -8) goto LAB_005e4dbb;
        }
        if (lVar17 != -1) {
          QGraphicsItem::ungrabKeyboard(this_00);
        }
        if (((*(ulong *)&((this_00->d_ptr).d)->field_0x160 & 0x400000000000) != 0) &&
           (this->panelModality != NonModal)) {
          QGraphicsScenePrivate::leaveModal
                    (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr);
        }
      }
      if ((bVar9) && ((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0)) {
        pQVar16 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
        if (((this->field_0x163 & 1) != 0) &&
           ((*(ulong *)&((pQVar16->d_ptr).d)->field_0x160 & 0x400000000000) == 0)) {
          pQVar15 = this->q_ptr;
          while (pQVar16 != pQVar15) {
            pQVar18 = (pQVar16->d_ptr).d;
            do {
              pQVar14 = pQVar18->parent;
              if (pQVar14 == (QGraphicsItem *)0x0) {
                pQVar14 = (QGraphicsItem *)0x0;
                goto LAB_005e4e64;
              }
              pQVar18 = (pQVar14->d_ptr).d;
            } while ((pQVar18->field_0x163 & 1) == 0);
            pQVar14 = pQVar14 + -1;
LAB_005e4e64:
            if ((pQVar14 == (QGraphicsItem *)0x0) ||
               (pQVar16 = pQVar14 + 1,
               (*(ulong *)&(pQVar14[1].d_ptr.d)->field_0x160 & 0x400000000000) != 0))
            goto LAB_005e4e93;
          }
          iVar12 = (*pQVar15[-1]._vptr_QGraphicsItem[0x1e])(pQVar15 + -1);
          if ((char)iVar12 != '\0') goto LAB_005e4ea1;
        }
LAB_005e4e93:
        clearFocusHelper(this,false,hiddenByPanel);
      }
LAB_005e4ea1:
      bVar10 = QGraphicsItem::isSelected(this->q_ptr);
      if (bVar10) {
        QGraphicsItem::setSelected(this->q_ptr,false);
      }
    }
    else {
      uVar4 = *(ulong *)&this->field_0x160;
      *(ulong *)&this->field_0x160 = uVar4 | 0x50000000000000;
      if (this->scene != (QGraphicsScene *)0x0) {
        if (((uint)uVar4 >> 0x18 & 1) != 0) {
          widget = (QGraphicsWidget *)(this->q_ptr + -1);
          if (this->q_ptr == (QGraphicsItem *)0x0) {
            widget = (QGraphicsWidget *)0x0;
          }
          WVar11 = QGraphicsWidget::windowType((QGraphicsWidget *)widget);
          if (WVar11 == Popup) {
            QGraphicsScenePrivate::addPopup
                      (*(QGraphicsScenePrivate **)&this->scene->field_0x8,widget);
          }
        }
        if (((*(ulong *)&((this_00->d_ptr).d)->field_0x160 & 0x400000000000) != 0) &&
           (this->panelModality != NonModal)) {
          QGraphicsScenePrivate::enterModal
                    (*(QGraphicsScenePrivate **)&this->scene->field_0x8,this->q_ptr,NonModal);
        }
      }
    }
    if (update) {
      if ((*(ulong *)&this->field_0x160 & 0x8001000000000) == 0) {
        bVar10 = true;
      }
      else {
        bVar10 = (bool)((byte)(uint)(*(ulong *)&this->field_0x160 >> 0x2a) & 1);
      }
    }
    else {
      bVar10 = false;
    }
    lVar17 = (this->children).d.size;
    if (lVar17 != 0) {
      ppQVar5 = (this->children).d.ptr;
      lVar19 = 0;
      do {
        lVar6 = *(long *)((long)ppQVar5 + lVar19);
        if ((bVar8 == false) || ((*(byte *)(*(long *)(lVar6 + 8) + 0x160) & 0x40) == 0)) {
          setVisibleHelper(*(QGraphicsItemPrivate **)(lVar6 + 8),bVar8,false,bVar10,hiddenByPanel);
        }
        lVar19 = lVar19 + 8;
      } while (lVar17 << 3 != lVar19);
    }
    if ((this->scene != (QGraphicsScene *)0x0) &&
       ((*(ulong *)&((this_00->d_ptr).d)->field_0x160 & 0x400000000000) != 0)) {
      if (bVar8 == false) {
        bVar10 = QGraphicsItem::isActive(this_00);
        if (bVar10) {
          QGraphicsScene::setActivePanel((QGraphicsScene *)this->scene,this->parent);
        }
      }
      else if ((this->parent != (QGraphicsItem *)0x0) &&
              (bVar10 = QGraphicsItem::isActive(this->parent), bVar10)) {
        QGraphicsItem::setActive(this_00,true);
      }
    }
    if (this->scene != (QGraphicsScene *)0x0) {
      pQVar16 = this->parent;
      if (bVar8 == false) {
        if (bVar9 && pQVar16 != (QGraphicsItem *)0x0) {
          do {
            pQVar18 = (pQVar16->d_ptr).d;
            if ((*(ulong *)&pQVar18->field_0x160 & 0x800000000000) != 0) {
              if ((*(ulong *)&pQVar18->field_0x160 & 0x20) != 0) {
                bVar8 = true;
                goto LAB_005e512c;
              }
              break;
            }
            pQVar16 = pQVar18->parent;
          } while (pQVar16 != (QGraphicsItem *)0x0);
        }
      }
      else {
        while (pQVar16 != (QGraphicsItem *)0x0) {
          pQVar18 = (pQVar16->d_ptr).d;
          if ((*(ulong *)&pQVar18->field_0x160 & 0x800000000000) != 0) {
            pQVar16 = pQVar18->focusScopeItem;
            if ((this->q_ptr == pQVar16) ||
               (bVar8 = QGraphicsItem::isAncestorOf(this->q_ptr,pQVar16), bVar8)) goto LAB_005e5072;
            break;
          }
          pQVar16 = pQVar18->parent;
        }
        pQVar16 = this->subFocusItem;
        if ((pQVar16 == (QGraphicsItem *)0x0) ||
           (pQVar15 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene), pQVar16 == pQVar15))
        {
          if ((((*(ulong *)&this->field_0x160 & 0x800000000000) != 0) &&
              (pQVar16 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene),
              pQVar16 == (QGraphicsItem *)0x0)) &&
             (bVar8 = QGraphicsItem::isAncestorOf
                                (this_00,*(QGraphicsItem **)(*(long *)&this->scene->field_0x8 + 400)
                                ), bVar8)) {
            pQVar18 = (this->q_ptr->d_ptr).d;
            goto LAB_005e510b;
          }
        }
        else {
          QGraphicsScene::setFocusItem((QGraphicsScene *)this->scene,pQVar16,OtherFocusReason);
        }
      }
    }
    goto LAB_005e5131;
  }
  goto LAB_005e5182;
  while ((((pQVar16->d_ptr).d)->field_0x160 & 0x20) != 0) {
LAB_005e5072:
    pQVar18 = (pQVar16->d_ptr).d;
    pQVar16 = pQVar18->focusScopeItem;
    if (pQVar16 == (QGraphicsItem *)0x0) break;
  }
LAB_005e510b:
  bVar8 = false;
LAB_005e512c:
  setFocusHelper(pQVar18,OtherFocusReason,true,bVar8);
LAB_005e5131:
  (*this->q_ptr->_vptr_QGraphicsItem[0x21])(&local_98,this->q_ptr,0xc);
  ::QVariant::~QVariant(&local_98);
  if ((this->field_0x167 & 1) != 0) {
    QMetaObject::activate
              ((QObject *)(this->q_ptr + -1),&QGraphicsObject::staticMetaObject,2,(void **)0x0);
  }
LAB_005e5182:
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_005e518c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setVisibleHelper(bool newVisible, bool explicitly,
                                            bool update, bool hiddenByPanel)
{
    Q_Q(QGraphicsItem);

    // Update explicit bit.
    if (explicitly)
        explicitlyHidden = newVisible ? 0 : 1;

    // Check if there's nothing to do.
    if (visible == quint32(newVisible))
        return;

    // Don't show child if parent is not visible
    if (parent && newVisible && !parent->d_ptr->visible)
        return;

    // Modify the property.
    const QVariant newVisibleVariant(q_ptr->itemChange(QGraphicsItem::ItemVisibleChange,
                                                       quint32(newVisible)));
    newVisible = newVisibleVariant.toBool();
    if (visible == quint32(newVisible))
        return;
    visible = newVisible;

    // Schedule redrawing
    if (update) {
        QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
        if (c)
            c->purge();
        if (scene) {
#if QT_CONFIG(graphicseffect)
            invalidateParentGraphicsEffectsRecursively();
#endif // QT_CONFIG(graphicseffect)
            scene->d_func()->markDirty(q_ptr, QRectF(), /*invalidateChildren=*/false, /*force=*/true);
        }
    }

    // Certain properties are dropped as an item becomes invisible.
    bool hasFocus = q_ptr->hasFocus();
    if (!newVisible) {
        if (scene) {
            if (scene->d_func()->mouseGrabberItems.contains(q))
                q->ungrabMouse();
            if (scene->d_func()->keyboardGrabberItems.contains(q))
                q->ungrabKeyboard();
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal)
                scene->d_func()->leaveModal(q_ptr);
        }
        if (hasFocus && scene) {
            // Hiding the focus item or the closest non-panel ancestor of the focus item
            QGraphicsItem *focusItem = scene->focusItem();
            bool clear = true;
            if (isWidget && !focusItem->isPanel()) {
                do {
                    if (focusItem == q_ptr) {
                        clear = !static_cast<QGraphicsWidget *>(q_ptr)->focusNextPrevChild(true);
                        break;
                    }
                } while ((focusItem = focusItem->parentWidget()) && !focusItem->isPanel());
            }
            if (clear)
                clearFocusHelper(/* giveFocusToParent = */ false, hiddenByPanel);
        }
        if (q_ptr->isSelected())
            q_ptr->setSelected(false);
    } else {
        geometryChanged = 1;
        paintedViewBoundingRectsNeedRepaint = 1;
        if (scene) {
            if (isWidget) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(q_ptr);
                if (widget->windowType() == Qt::Popup)
                    scene->d_func()->addPopup(widget);
            }
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal) {
                scene->d_func()->enterModal(q_ptr);
            }
        }
    }

    // Update children with explicitly = false.
    const bool updateChildren = update && !((flags & QGraphicsItem::ItemClipsChildrenToShape
                                             || flags & QGraphicsItem::ItemContainsChildrenInShape)
                                            && !(flags & QGraphicsItem::ItemHasNoContents));
    for (QGraphicsItem *child : std::as_const(children)) {
        if (!newVisible || !child->d_ptr->explicitlyHidden)
            child->d_ptr->setVisibleHelper(newVisible, false, updateChildren, hiddenByPanel);
    }

    // Update activation
    if (scene && q->isPanel()) {
        if (newVisible) {
            if (parent && parent->isActive())
                q->setActive(true);
        } else {
            if (q->isActive())
                scene->setActivePanel(parent);
        }
    }

    // Enable subfocus
    if (scene) {
        if (newVisible) {
            // Item is shown
            QGraphicsItem *p = parent;
            bool done = false;
            while (p) {
                if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                    QGraphicsItem *fsi = p->d_ptr->focusScopeItem;
                    if (q_ptr == fsi || q_ptr->isAncestorOf(fsi)) {
                        done = true;
                        while (fsi->d_ptr->focusScopeItem && fsi->d_ptr->focusScopeItem->isVisible())
                            fsi = fsi->d_ptr->focusScopeItem;
                        fsi->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                   /* focusFromHide = */ false);
                    }
                    break;
                }
                p = p->d_ptr->parent;
            }
            if (!done) {
                QGraphicsItem *fi = subFocusItem;
                if (fi && fi != scene->focusItem()) {
                    scene->setFocusItem(fi);
                } else if (flags & QGraphicsItem::ItemIsFocusScope &&
                           !scene->focusItem() &&
                           q->isAncestorOf(scene->d_func()->lastFocusItem)) {
                    q_ptr->setFocus();
                }
            }
        } else {
            // Item is hidden
            if (hasFocus) {
                QGraphicsItem *p = parent;
                while (p) {
                    if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                        if (p->d_ptr->visible) {
                            p->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                     /* focusFromHide = */ true);
                        }
                        break;
                    }
                    p = p->d_ptr->parent;
                }
            }
        }
    }

    // Deliver post-change notification.
    q_ptr->itemChange(QGraphicsItem::ItemVisibleHasChanged, newVisibleVariant);

    if (isObject)
        emit static_cast<QGraphicsObject *>(q_ptr)->visibleChanged();
}